

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O2

int __thiscall
ring_buffer_base<cubeb_log_message>::dequeue
          (ring_buffer_base<cubeb_log_message> *this,cubeb_log_message *elements,int count)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = (this->read_index_).super___atomic_base<int>._M_i;
  iVar2 = (this->write_index_).super___atomic_base<int>._M_i;
  iVar3 = 0;
  if (iVar2 != iVar1) {
    iVar5 = this->capacity_;
    iVar4 = 0;
    if (iVar2 < iVar1) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 + (iVar2 - iVar1);
    iVar3 = count;
    if (iVar4 < count) {
      iVar3 = iVar4;
    }
    if (elements != (cubeb_log_message *)0x0) {
      iVar2 = iVar5 - iVar1;
      if (iVar3 < iVar5 - iVar1) {
        iVar2 = iVar3;
      }
      Copy<cubeb_log_message>
                (elements,(this->data_)._M_t.
                          super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
                          .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl + iVar1,
                 (long)iVar2);
      Copy<cubeb_log_message>
                (elements + iVar2,
                 (this->data_)._M_t.
                 super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
                 .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl,
                 (long)(iVar3 - iVar2));
      iVar5 = this->capacity_;
    }
    (this->read_index_).super___atomic_base<int>._M_i = (iVar1 + iVar3) % iVar5;
  }
  return iVar3;
}

Assistant:

int dequeue(T * elements, int count)
  {
#ifndef NDEBUG
    assert_correct_thread(consumer_id);
#endif

    int rd_idx = read_index_.load(std::memory_order_relaxed);
    int wr_idx = write_index_.load(std::memory_order_acquire);

    if (empty_internal(rd_idx, wr_idx)) {
      return 0;
    }

    int to_read = std::min(available_read_internal(rd_idx, wr_idx), count);

    int first_part = std::min(storage_capacity() - rd_idx, to_read);
    int second_part = to_read - first_part;

    if (elements) {
      Copy(elements, data_.get() + rd_idx, first_part);
      Copy(elements + first_part, data_.get(), second_part);
    }

    read_index_.store(increment_index(rd_idx, to_read),
                      std::memory_order_release);

    return to_read;
  }